

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

void Abc_NtkPerformMfs3(Abc_Ntk_t *pNtk,Sfm_Par_t *pPars)

{
  uint uVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  Sfm_Dec_t *p;
  void *pvVar9;
  word wVar10;
  Vec_Ptr_t *pVVar11;
  Vec_Int_t *p_00;
  int iVar12;
  long lVar13;
  char *pcVar14;
  size_t sVar15;
  long lVar16;
  word local_68 [7];
  
  p = Sfm_DecStart(pPars,(Mio_Library_t *)pNtk->pManFunc,pNtk);
  if (pPars->fVerbose != 0) {
    printf("Remapping parameters: ");
    if (pPars->nTfoLevMax != 0) {
      printf("TFO = %d. ");
    }
    if (pPars->nTfiLevMax != 0) {
      printf("TFI = %d. ");
    }
    if (pPars->nFanoutMax != 0) {
      printf("FanMax = %d. ");
    }
    if (pPars->nWinSizeMax != 0) {
      printf("WinMax = %d. ");
    }
    if (pPars->nBTLimit != 0) {
      printf("Confl = %d. ");
    }
    if ((pPars->nMffcMin != 0) && (pPars->fArea != 0)) {
      printf("MffcMin = %d. ");
    }
    if ((pPars->nMffcMax != 0) && (pPars->fArea != 0)) {
      printf("MffcMax = %d. ");
    }
    if (pPars->nDecMax != 0) {
      printf("DecMax = %d. ");
    }
    if (pPars->iNodeOne != 0) {
      printf("Pivot = %d. ");
    }
    if (pPars->fArea == 0) {
      printf("Win = %d. ",(ulong)(uint)pPars->nTimeWin);
    }
    if (pPars->fArea == 0) {
      printf("Delta = %.2f ps. ",(double)p->DeltaCrit * 0.001);
    }
    if (pPars->fArea != 0) {
      pcVar14 = "yes";
      if (pPars->fZeroCost == 0) {
        pcVar14 = "no";
      }
      printf("0-cost = %s. ",pcVar14);
    }
    pcVar14 = "yes";
    if (pPars->fMoreEffort == 0) {
      pcVar14 = "no";
    }
    printf("Effort = %s. ",pcVar14);
    printf("Sim = %s. ");
    putchar(10);
  }
  Abc_NtkLevel(pNtk);
  if (p->pPars->fUseSim != 0) {
    if (pNtk->vPis->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    plVar2 = *(long **)(**pNtk->vPis->pArray + 0x158);
    iVar8 = pNtk->vObjs->nSize;
    uVar7 = (long)iVar8 * 2;
    iVar12 = (int)uVar7;
    if ((int)plVar2[0x28] < iVar12) {
      sVar15 = (long)iVar8 << 4;
      if ((void *)plVar2[0x29] == (void *)0x0) {
        pvVar9 = malloc(sVar15);
      }
      else {
        pvVar9 = realloc((void *)plVar2[0x29],sVar15);
      }
      plVar2[0x29] = (long)pvVar9;
      if (pvVar9 == (void *)0x0) goto LAB_004b73c0;
      *(int *)(plVar2 + 0x28) = iVar12;
    }
    if (0 < iVar8) {
      memset((void *)plVar2[0x29],0,(uVar7 & 0xffffffff) << 3);
    }
    *(int *)((long)plVar2 + 0x144) = iVar12;
    iVar8 = pNtk->vObjs->nSize;
    uVar7 = (long)iVar8 * 2;
    iVar12 = (int)uVar7;
    if ((int)plVar2[0x2a] < iVar12) {
      sVar15 = (long)iVar8 << 4;
      if ((void *)plVar2[0x2b] == (void *)0x0) {
        pvVar9 = malloc(sVar15);
      }
      else {
        pvVar9 = realloc((void *)plVar2[0x2b],sVar15);
      }
      plVar2[0x2b] = (long)pvVar9;
      if (pvVar9 == (void *)0x0) {
LAB_004b73c0:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                      ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
      }
      *(int *)(plVar2 + 0x2a) = iVar12;
    }
    if (0 < iVar8) {
      memset((void *)plVar2[0x2b],0,(uVar7 & 0xffffffff) << 3);
    }
    *(int *)((long)plVar2 + 0x154) = iVar12;
    Gia_ManRandomW(1);
    if (*(int *)(*plVar2 + 0x58) == 0) {
      __assert_fail("p->pPars->fUseSim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                    ,0x14c,"void Sfm_NtkSimulate(Abc_Ntk_t *)");
    }
    pVVar11 = pNtk->vCis;
    if (0 < pVVar11->nSize) {
      lVar13 = 0;
      do {
        iVar8 = *(int *)((long)pVVar11->pArray[lVar13] + 0x10);
        wVar10 = Gia_ManRandomW(0);
        if (((long)iVar8 < 0) || (*(int *)((long)plVar2 + 0x144) <= iVar8)) goto LAB_004b7363;
        *(word *)(plVar2[0x29] + (long)iVar8 * 8) = wVar10;
        lVar13 = lVar13 + 1;
        pVVar11 = pNtk->vCis;
      } while (lVar13 < pVVar11->nSize);
    }
    pVVar11 = Abc_NtkDfs(pNtk,1);
    if (0 < pVVar11->nSize) {
      lVar13 = 0;
      do {
        plVar3 = (long *)pVVar11->pArray[lVar13];
        uVar1 = *(uint *)(plVar3 + 2);
        lVar4 = *(long *)(*plVar3 + 0x158);
        p_00 = Mio_GateReadExpr((Mio_Gate_t *)plVar3[7]);
        iVar8 = *(int *)((long)plVar3 + 0x1c);
        if (6 < (long)iVar8) {
          __assert_fail("Abc_ObjFaninNum(pObj) <= 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                        ,0x133,"word Sfm_ObjSimulate(Abc_Obj_t *)");
        }
        if (0 < iVar8) {
          lVar5 = plVar3[4];
          lVar6 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
          lVar16 = 0;
          do {
            iVar12 = *(int *)(*(long *)(lVar6 + (long)*(int *)(lVar5 + lVar16 * 4) * 8) + 0x10);
            if (((long)iVar12 < 0) || (*(int *)(lVar4 + 0x144) <= iVar12)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                            ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
            }
            local_68[lVar16] = *(word *)(*(long *)(lVar4 + 0x148) + (long)iVar12 * 8);
            lVar16 = lVar16 + 1;
          } while (iVar8 != lVar16);
        }
        wVar10 = Exp_Truth6(iVar8,p_00,local_68);
        if (((int)uVar1 < 0) || (*(int *)((long)plVar2 + 0x144) <= (int)uVar1)) {
LAB_004b7363:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
        }
        *(word *)(plVar2[0x29] + (ulong)uVar1 * 8) = wVar10;
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar11->nSize);
    }
    if (pVVar11->pArray != (void **)0x0) {
      free(pVVar11->pArray);
      pVVar11->pArray = (void **)0x0;
    }
    if (pVVar11 != (Vec_Ptr_t *)0x0) {
      free(pVVar11);
    }
  }
  if (pPars->fVerbose != 0) {
    p->nTotalNodesBeg = pNtk->nObjCounts[7];
    iVar8 = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalEdgesBeg = iVar8;
  }
  if (pPars->fArea == 0) {
    Abc_NtkDelayOpt(p);
  }
  else if (pPars->fAreaRev == 0) {
    Abc_NtkAreaOpt(p);
  }
  else {
    Abc_NtkAreaOpt2(p);
  }
  if (pPars->fVerbose != 0) {
    p->nTotalNodesEnd = pNtk->nObjCounts[7];
    iVar8 = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalEdgesEnd = iVar8;
  }
  if (pPars->fVerbose != 0) {
    Sfm_DecPrintStats(p);
  }
  if (pPars->fLibVerbose != 0) {
    Sfm_LibPrint(p->pLib);
  }
  Sfm_DecStop(p);
  return;
}

Assistant:

void Abc_NtkPerformMfs3( Abc_Ntk_t * pNtk, Sfm_Par_t * pPars )
{
    Sfm_Dec_t * p = Sfm_DecStart( pPars, (Mio_Library_t *)pNtk->pManFunc, pNtk );
    if ( pPars->fVerbose )
    {
        printf( "Remapping parameters: " );
        if ( pPars->nTfoLevMax )
            printf( "TFO = %d. ",     pPars->nTfoLevMax );
        if ( pPars->nTfiLevMax )
            printf( "TFI = %d. ",     pPars->nTfiLevMax );
        if ( pPars->nFanoutMax )
            printf( "FanMax = %d. ",  pPars->nFanoutMax );
        if ( pPars->nWinSizeMax )
            printf( "WinMax = %d. ",  pPars->nWinSizeMax );
        if ( pPars->nBTLimit )
            printf( "Confl = %d. ",   pPars->nBTLimit );
        if ( pPars->nMffcMin && pPars->fArea )
            printf( "MffcMin = %d. ", pPars->nMffcMin );
        if ( pPars->nMffcMax && pPars->fArea )
            printf( "MffcMax = %d. ", pPars->nMffcMax );
        if ( pPars->nDecMax )
            printf( "DecMax = %d. ",  pPars->nDecMax );
        if ( pPars->iNodeOne )
            printf( "Pivot = %d. ",   pPars->iNodeOne );
        if ( !pPars->fArea )
            printf( "Win = %d. ",     pPars->nTimeWin );
        if ( !pPars->fArea )
            printf( "Delta = %.2f ps. ", MIO_NUMINV*p->DeltaCrit );
        if ( pPars->fArea )
            printf( "0-cost = %s. ",  pPars->fZeroCost ? "yes" : "no" );
        printf( "Effort = %s. ",      pPars->fMoreEffort ? "yes" : "no" );
        printf( "Sim = %s. ",         pPars->fUseSim ? "yes" : "no" );
        printf( "\n" );
    }
    // preparation steps
    Abc_NtkLevel( pNtk );
    if ( p->pPars->fUseSim )
        Sfm_NtkSimulate( pNtk );
    // record statistics
    if ( pPars->fVerbose ) p->nTotalNodesBeg = Abc_NtkNodeNum(pNtk);
    if ( pPars->fVerbose ) p->nTotalEdgesBeg = Abc_NtkGetTotalFanins(pNtk);
    // perform optimization
    if ( pPars->fArea )
    {
        if ( pPars->fAreaRev )
            Abc_NtkAreaOpt2( p );
        else
            Abc_NtkAreaOpt( p );
    }
    else
        Abc_NtkDelayOpt( p );
    // record statistics
    if ( pPars->fVerbose ) p->nTotalNodesEnd = Abc_NtkNodeNum(pNtk);
    if ( pPars->fVerbose ) p->nTotalEdgesEnd = Abc_NtkGetTotalFanins(pNtk);
    // print stats and quit
    if ( pPars->fVerbose )
    Sfm_DecPrintStats( p );
    if ( pPars->fLibVerbose )
        Sfm_LibPrint( p->pLib );
    Sfm_DecStop( p );
}